

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

void __thiscall
cmListFileParser::cmListFileParser
          (cmListFileParser *this,cmListFile *lf,cmMakefile *mf,char *filename)

{
  cmListFileLexer *pcVar1;
  
  this->ListFile = lf;
  this->Makefile = mf;
  this->FileName = filename;
  pcVar1 = cmListFileLexer_New();
  this->Lexer = pcVar1;
  (this->Function).super_cmListFileContext.Name._M_dataplus._M_p =
       (pointer)&(this->Function).super_cmListFileContext.Name.field_2;
  (this->Function).super_cmListFileContext.Name._M_string_length = 0;
  (this->Function).super_cmListFileContext.Name.field_2._M_local_buf[0] = '\0';
  (this->Function).super_cmListFileContext.FilePath._M_dataplus._M_p =
       (pointer)&(this->Function).super_cmListFileContext.FilePath.field_2;
  (this->Function).super_cmListFileContext.FilePath._M_string_length = 0;
  (this->Function).super_cmListFileContext.FilePath.field_2._M_local_buf[0] = '\0';
  (this->Function).super_cmListFileContext.Line = 0;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmListFileParser::cmListFileParser(cmListFile* lf, cmMakefile* mf,
                                   const char* filename):
  ListFile(lf), Makefile(mf), FileName(filename),
  Lexer(cmListFileLexer_New())
{
}